

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iStart;
  BYTE *iEnd;
  int *iLimit;
  char *pcVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  BYTE *base;
  BYTE *pBVar5;
  U32 *pUVar6;
  U16 *pUVar7;
  ushort uVar8;
  undefined8 uVar9;
  uint uVar10;
  int iVar11;
  int *ilimit_w;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  BYTE *pBVar17;
  seqDef *psVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  U32 UVar22;
  uint uVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  BYTE *pBVar26;
  int iVar27;
  U32 UVar28;
  ulong uVar29;
  uint uVar30;
  U32 UVar31;
  uint uVar32;
  ulong uVar33;
  int iVar34;
  uint uVar35;
  BYTE *litEnd;
  uint uVar36;
  long lVar37;
  int *piVar38;
  int *pIn;
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  byte bVar77;
  byte bVar78;
  byte bVar79;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint local_14c;
  int *local_130;
  U32 maxDistance;
  BYTE *litLimit_w;
  uint auStack_b8 [34];
  char cVar46;
  undefined1 uVar64;
  char cVar65;
  undefined1 uVar66;
  char cVar67;
  undefined1 uVar68;
  char cVar69;
  
  base = (ms->window).base;
  pBVar5 = (ms->window).dictBase;
  uVar3 = (ms->window).dictLimit;
  iStart = base + uVar3;
  pBVar25 = pBVar5 + uVar3;
  uVar4 = (ms->window).lowLimit;
  pIn = (int *)((ulong)(iStart == (BYTE *)src) + (long)src);
  uVar10 = (ms->cParams).minMatch;
  UVar31 = 6;
  if (uVar10 < 6) {
    UVar31 = uVar10;
  }
  uVar10 = (ms->cParams).windowLog;
  iEnd = (BYTE *)((long)src + srcSize);
  iLimit = (int *)((long)src + (srcSize - 0x10));
  local_14c = *rep;
  UVar28 = rep[1];
  ZSTD_row_fillHashCache
            (ms,base,5 - ((ms->cParams).searchLog < 5),UVar31,ms->nextToUpdate,(BYTE *)iLimit);
  uVar10 = 1 << ((byte)uVar10 & 0x1f);
  iVar11 = uVar3 - 1;
  ilimit_w = (int *)((long)src + (srcSize - 0x20));
LAB_001daa17:
  do {
    if (iLimit <= pIn) {
      *rep = local_14c;
      rep[1] = UVar28;
      return (long)iEnd - (long)src;
    }
    iVar27 = (int)pIn - (int)base;
    iVar34 = iVar27 + 1;
    uVar21 = (ms->window).lowLimit;
    UVar31 = ms->loadedDictEnd;
    uVar23 = iVar34 - uVar10;
    if (iVar34 - uVar21 <= uVar10) {
      uVar23 = uVar21;
    }
    if (UVar31 != 0) {
      uVar23 = uVar21;
    }
    uVar35 = iVar34 - local_14c;
    pBVar17 = base;
    if (uVar35 < uVar3) {
      pBVar17 = pBVar5;
    }
    if (iVar11 - uVar35 < 3) {
LAB_001daada:
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      if (local_14c < (iVar27 - uVar23) + 1) {
        if (*(int *)((long)pIn + 1) != *(int *)(pBVar17 + uVar35)) goto LAB_001daada;
        pBVar24 = iEnd;
        if (uVar35 < uVar3) {
          pBVar24 = pBVar25;
        }
        sVar13 = ZSTD_count_2segments
                           ((BYTE *)((long)pIn + 5),(BYTE *)((long)(pBVar17 + uVar35) + 4),iEnd,
                            pBVar24,iStart);
        uVar12 = sVar13 + 4;
      }
    }
    uVar23 = (ms->cParams).searchLog;
    uVar35 = (ms->cParams).minMatch;
    if (uVar23 < 5) {
      bVar19 = (byte)uVar23;
      if (uVar35 - 6 < 2) {
        pBVar17 = (ms->window).base;
        pBVar24 = (ms->window).dictBase;
        uVar14 = (long)pIn - (long)pBVar17;
        uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar30 = (uint)uVar14;
        uVar23 = uVar30 - uVar35;
        if (uVar30 - uVar21 <= uVar35) {
          uVar23 = uVar21;
        }
        uVar35 = (ms->window).dictLimit;
        pUVar6 = ms->hashTable;
        pUVar7 = ms->tagTable;
        if (UVar31 != 0) {
          uVar23 = uVar21;
        }
        bVar20 = 0x38 - (char)ms->rowHashLog;
        for (uVar33 = (ulong)ms->nextToUpdate; uVar33 < (uVar14 & 0xffffffff); uVar33 = uVar33 + 1)
        {
          uVar32 = (uint)uVar33 & 7;
          uVar21 = ms->hashCache[uVar32];
          ms->hashCache[uVar32] =
               (U32)((ulong)(*(long *)(pBVar17 + uVar33 + 8) * -0x30e4432340650000) >>
                    (bVar20 & 0x3f));
          uVar15 = (ulong)(uVar21 >> 4 & 0xfffffff0);
          uVar32 = (byte)((char)pUVar7[uVar15] - 1) & 0xf;
          *(char *)(pUVar7 + uVar15) = (char)uVar32;
          *(char *)((long)pUVar7 + (ulong)uVar32 + 1 + uVar15 * 2) = (char)uVar21;
          pUVar6[uVar15 + uVar32] = (uint)uVar33;
        }
        ms->nextToUpdate = uVar30;
        uVar21 = ms->hashCache[uVar30 & 7];
        ms->hashCache[uVar30 & 7] =
             (U32)((ulong)(*(long *)(pBVar17 + (uVar14 & 0xffffffff) + 8) * -0x30e4432340650000) >>
                  (bVar20 & 0x3f));
        uVar14 = (ulong)(uVar21 >> 4 & 0xfffffff0);
        bVar20 = (byte)pUVar7[uVar14];
        pcVar1 = (char *)((long)pUVar7 + uVar14 * 2 + 1);
        uVar68 = (undefined1)(uVar21 >> 0x18);
        uVar66 = (undefined1)(uVar21 >> 0x10);
        uVar64 = (undefined1)(uVar21 >> 8);
        auVar71._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar68),uVar66),CONCAT14(uVar66,uVar21)) >>
                  0x20);
        auVar71[3] = uVar64;
        auVar71[2] = uVar64;
        auVar71[0] = (undefined1)uVar21;
        auVar71[1] = auVar71[0];
        auVar71._8_8_ = 0;
        auVar48 = pshuflw(auVar71,auVar71,0);
        cVar46 = auVar48[0];
        auVar49[0] = -(cVar46 == *pcVar1);
        cVar65 = auVar48[1];
        auVar49[1] = -(cVar65 == pcVar1[1]);
        cVar67 = auVar48[2];
        auVar49[2] = -(cVar67 == pcVar1[2]);
        cVar69 = auVar48[3];
        auVar49[3] = -(cVar69 == pcVar1[3]);
        auVar49[4] = -(cVar46 == pcVar1[4]);
        auVar49[5] = -(cVar65 == pcVar1[5]);
        auVar49[6] = -(cVar67 == pcVar1[6]);
        auVar49[7] = -(cVar69 == pcVar1[7]);
        auVar49[8] = -(cVar46 == pcVar1[8]);
        auVar49[9] = -(cVar65 == pcVar1[9]);
        auVar49[10] = -(cVar67 == pcVar1[10]);
        auVar49[0xb] = -(cVar69 == pcVar1[0xb]);
        auVar49[0xc] = -(cVar46 == pcVar1[0xc]);
        auVar49[0xd] = -(cVar65 == pcVar1[0xd]);
        auVar49[0xe] = -(cVar67 == pcVar1[0xe]);
        auVar49[0xf] = -(cVar69 == pcVar1[0xf]);
        uVar8 = (ushort)(SUB161(auVar49 >> 7,0) & 1) | (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe | (ushort)(auVar49[0xf] >> 7) << 0xf;
        uVar21 = (uint)uVar8;
        if ((bVar20 & 0xf) != 0) {
          uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                   (uint)(uVar8 >> (bVar20 & 0xf));
        }
        for (lVar39 = 0; (uVar21 != 0 && ((int)(1L << (bVar19 & 0x3f)) != (int)lVar39));
            lVar39 = lVar39 + 1) {
          iVar34 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
            }
          }
          if (pUVar6[uVar14 + (iVar34 + (uint)bVar20 & 0xf)] < uVar23) break;
          auStack_b8[lVar39] = pUVar6[uVar14 + (iVar34 + (uint)bVar20 & 0xf)];
          uVar21 = uVar21 - 1 & uVar21;
        }
        uVar21 = bVar20 - 1 & 0xf;
        *(char *)(pUVar7 + uVar14) = (char)uVar21;
        *(undefined1 *)((long)(pUVar7 + uVar14) + (ulong)uVar21 + 1) = auVar71[0];
        UVar31 = ms->nextToUpdate;
        ms->nextToUpdate = UVar31 + 1;
        pUVar6[uVar14 + uVar21] = UVar31;
        uVar33 = 999999999;
        uVar14 = 3;
        for (lVar37 = 0; lVar39 != lVar37; lVar37 = lVar37 + 1) {
          uVar21 = auStack_b8[lVar37];
          if (uVar21 < uVar35) {
            if (*(int *)(pBVar24 + uVar21) == *pIn) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)(pIn + 1),pBVar24 + (ulong)uVar21 + 4,iEnd,
                                  pBVar24 + uVar35,pBVar17 + uVar35);
              uVar15 = sVar13 + 4;
LAB_001db273:
              if ((uVar14 < uVar15) &&
                 (uVar33 = (ulong)((uVar30 + 2) - uVar21), uVar14 = uVar15,
                 (BYTE *)((long)pIn + uVar15) == iEnd)) break;
            }
          }
          else if ((pBVar17 + uVar21)[uVar14] == *(BYTE *)((long)pIn + uVar14)) {
            uVar15 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar21,iEnd);
            goto LAB_001db273;
          }
        }
      }
      else if (uVar35 == 5) {
        pBVar17 = (ms->window).base;
        pBVar24 = (ms->window).dictBase;
        uVar14 = (long)pIn - (long)pBVar17;
        uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar30 = (uint)uVar14;
        uVar23 = uVar30 - uVar35;
        if (uVar30 - uVar21 <= uVar35) {
          uVar23 = uVar21;
        }
        uVar35 = (ms->window).dictLimit;
        pUVar6 = ms->hashTable;
        pUVar7 = ms->tagTable;
        if (UVar31 != 0) {
          uVar23 = uVar21;
        }
        bVar20 = 0x38 - (char)ms->rowHashLog;
        for (uVar33 = (ulong)ms->nextToUpdate; uVar33 < (uVar14 & 0xffffffff); uVar33 = uVar33 + 1)
        {
          uVar32 = (uint)uVar33 & 7;
          uVar21 = ms->hashCache[uVar32];
          ms->hashCache[uVar32] =
               (U32)((ulong)(*(long *)(pBVar17 + uVar33 + 8) * -0x30e4432345000000) >>
                    (bVar20 & 0x3f));
          uVar15 = (ulong)(uVar21 >> 4 & 0xfffffff0);
          uVar32 = (byte)((char)pUVar7[uVar15] - 1) & 0xf;
          *(char *)(pUVar7 + uVar15) = (char)uVar32;
          *(char *)((long)pUVar7 + (ulong)uVar32 + 1 + uVar15 * 2) = (char)uVar21;
          pUVar6[uVar15 + uVar32] = (uint)uVar33;
        }
        ms->nextToUpdate = uVar30;
        uVar21 = ms->hashCache[uVar30 & 7];
        ms->hashCache[uVar30 & 7] =
             (U32)((ulong)(*(long *)(pBVar17 + (uVar14 & 0xffffffff) + 8) * -0x30e4432345000000) >>
                  (bVar20 & 0x3f));
        uVar14 = (ulong)(uVar21 >> 4 & 0xfffffff0);
        bVar20 = (byte)pUVar7[uVar14];
        pcVar1 = (char *)((long)pUVar7 + uVar14 * 2 + 1);
        uVar68 = (undefined1)(uVar21 >> 0x18);
        uVar66 = (undefined1)(uVar21 >> 0x10);
        uVar64 = (undefined1)(uVar21 >> 8);
        auVar51._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar68),uVar66),CONCAT14(uVar66,uVar21)) >>
                  0x20);
        auVar51[3] = uVar64;
        auVar51[2] = uVar64;
        auVar51[0] = (undefined1)uVar21;
        auVar51[1] = auVar51[0];
        auVar51._8_8_ = 0;
        auVar71 = pshuflw(auVar51,auVar51,0);
        cVar46 = auVar71[0];
        auVar52[0] = -(cVar46 == *pcVar1);
        cVar65 = auVar71[1];
        auVar52[1] = -(cVar65 == pcVar1[1]);
        cVar67 = auVar71[2];
        auVar52[2] = -(cVar67 == pcVar1[2]);
        cVar69 = auVar71[3];
        auVar52[3] = -(cVar69 == pcVar1[3]);
        auVar52[4] = -(cVar46 == pcVar1[4]);
        auVar52[5] = -(cVar65 == pcVar1[5]);
        auVar52[6] = -(cVar67 == pcVar1[6]);
        auVar52[7] = -(cVar69 == pcVar1[7]);
        auVar52[8] = -(cVar46 == pcVar1[8]);
        auVar52[9] = -(cVar65 == pcVar1[9]);
        auVar52[10] = -(cVar67 == pcVar1[10]);
        auVar52[0xb] = -(cVar69 == pcVar1[0xb]);
        auVar52[0xc] = -(cVar46 == pcVar1[0xc]);
        auVar52[0xd] = -(cVar65 == pcVar1[0xd]);
        auVar52[0xe] = -(cVar67 == pcVar1[0xe]);
        auVar52[0xf] = -(cVar69 == pcVar1[0xf]);
        uVar8 = (ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe | (ushort)(auVar52[0xf] >> 7) << 0xf;
        uVar21 = (uint)uVar8;
        if ((bVar20 & 0xf) != 0) {
          uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                   (uint)(uVar8 >> (bVar20 & 0xf));
        }
        for (uVar15 = 0; (uVar21 != 0 && (1 << (bVar19 & 0x1f) != (int)uVar15)); uVar15 = uVar15 + 1
            ) {
          iVar34 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
            }
          }
          if (pUVar6[uVar14 + (iVar34 + (uint)bVar20 & 0xf)] < uVar23) break;
          auStack_b8[uVar15] = pUVar6[uVar14 + (iVar34 + (uint)bVar20 & 0xf)];
          uVar21 = uVar21 - 1 & uVar21;
        }
        uVar21 = bVar20 - 1 & 0xf;
        *(char *)(pUVar7 + uVar14) = (char)uVar21;
        *(undefined1 *)((long)(pUVar7 + uVar14) + (ulong)uVar21 + 1) = auVar51[0];
        UVar31 = ms->nextToUpdate;
        ms->nextToUpdate = UVar31 + 1;
        pUVar6[uVar14 + uVar21] = UVar31;
        uVar33 = 999999999;
        uVar14 = 3;
        for (uVar29 = (ulong)(uint)(0 << (bVar19 & 0x1f)); uVar15 != uVar29; uVar29 = uVar29 + 1) {
          uVar21 = auStack_b8[uVar29];
          if (uVar21 < uVar35) {
            if (*(int *)(pBVar24 + uVar21) == *pIn) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)(pIn + 1),pBVar24 + (ulong)uVar21 + 4,iEnd,
                                  pBVar24 + uVar35,pBVar17 + uVar35);
              uVar16 = sVar13 + 4;
LAB_001db9f7:
              if ((uVar14 < uVar16) &&
                 (uVar33 = (ulong)((uVar30 + 2) - uVar21), uVar14 = uVar16,
                 (BYTE *)((long)pIn + uVar16) == iEnd)) break;
            }
          }
          else if ((pBVar17 + uVar21)[uVar14] == *(BYTE *)((long)pIn + uVar14)) {
            uVar16 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar21,iEnd);
            goto LAB_001db9f7;
          }
        }
      }
      else {
        pBVar17 = (ms->window).base;
        pBVar24 = (ms->window).dictBase;
        uVar14 = (long)pIn - (long)pBVar17;
        uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar30 = (uint)uVar14;
        uVar23 = uVar30 - uVar35;
        if (uVar30 - uVar21 <= uVar35) {
          uVar23 = uVar21;
        }
        uVar35 = (ms->window).dictLimit;
        pUVar6 = ms->hashTable;
        pUVar7 = ms->tagTable;
        if (UVar31 != 0) {
          uVar23 = uVar21;
        }
        bVar20 = 0x18 - (char)ms->rowHashLog;
        for (uVar33 = (ulong)ms->nextToUpdate; uVar33 < (uVar14 & 0xffffffff); uVar33 = uVar33 + 1)
        {
          uVar32 = (uint)uVar33 & 7;
          uVar21 = ms->hashCache[uVar32];
          ms->hashCache[uVar32] =
               (uint)(*(int *)(pBVar17 + uVar33 + 8) * -0x61c8864f) >> (bVar20 & 0x1f);
          uVar15 = (ulong)(uVar21 >> 4 & 0xfffffff0);
          uVar32 = (byte)((char)pUVar7[uVar15] - 1) & 0xf;
          *(char *)(pUVar7 + uVar15) = (char)uVar32;
          *(char *)((long)pUVar7 + (ulong)uVar32 + 1 + uVar15 * 2) = (char)uVar21;
          pUVar6[uVar15 + uVar32] = (uint)uVar33;
        }
        ms->nextToUpdate = uVar30;
        uVar21 = ms->hashCache[uVar30 & 7];
        ms->hashCache[uVar30 & 7] =
             (uint)(*(int *)(pBVar17 + (uVar14 & 0xffffffff) + 8) * -0x61c8864f) >> (bVar20 & 0x1f);
        uVar14 = (ulong)(uVar21 >> 4 & 0xfffffff0);
        bVar20 = (byte)pUVar7[uVar14];
        pcVar1 = (char *)((long)pUVar7 + uVar14 * 2 + 1);
        uVar68 = (undefined1)(uVar21 >> 0x18);
        uVar66 = (undefined1)(uVar21 >> 0x10);
        uVar64 = (undefined1)(uVar21 >> 8);
        auVar48._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar68),uVar66),CONCAT14(uVar66,uVar21)) >>
                  0x20);
        auVar48[3] = uVar64;
        auVar48[2] = uVar64;
        auVar48[0] = (undefined1)uVar21;
        auVar48[1] = auVar48[0];
        auVar48._8_8_ = 0;
        auVar71 = pshuflw(auVar48,auVar48,0);
        cVar46 = auVar71[0];
        auVar54[0] = -(cVar46 == *pcVar1);
        cVar65 = auVar71[1];
        auVar54[1] = -(cVar65 == pcVar1[1]);
        cVar67 = auVar71[2];
        auVar54[2] = -(cVar67 == pcVar1[2]);
        cVar69 = auVar71[3];
        auVar54[3] = -(cVar69 == pcVar1[3]);
        auVar54[4] = -(cVar46 == pcVar1[4]);
        auVar54[5] = -(cVar65 == pcVar1[5]);
        auVar54[6] = -(cVar67 == pcVar1[6]);
        auVar54[7] = -(cVar69 == pcVar1[7]);
        auVar54[8] = -(cVar46 == pcVar1[8]);
        auVar54[9] = -(cVar65 == pcVar1[9]);
        auVar54[10] = -(cVar67 == pcVar1[10]);
        auVar54[0xb] = -(cVar69 == pcVar1[0xb]);
        auVar54[0xc] = -(cVar46 == pcVar1[0xc]);
        auVar54[0xd] = -(cVar65 == pcVar1[0xd]);
        auVar54[0xe] = -(cVar67 == pcVar1[0xe]);
        auVar54[0xf] = -(cVar69 == pcVar1[0xf]);
        uVar8 = (ushort)(SUB161(auVar54 >> 7,0) & 1) | (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe | (ushort)(auVar54[0xf] >> 7) << 0xf;
        uVar21 = (uint)uVar8;
        if ((bVar20 & 0xf) != 0) {
          uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                   (uint)(uVar8 >> (bVar20 & 0xf));
        }
        for (lVar39 = 0; (uVar21 != 0 && ((int)(1L << (bVar19 & 0x3f)) != (int)lVar39));
            lVar39 = lVar39 + 1) {
          iVar34 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
            }
          }
          if (pUVar6[uVar14 + (iVar34 + (uint)bVar20 & 0xf)] < uVar23) break;
          auStack_b8[lVar39] = pUVar6[uVar14 + (iVar34 + (uint)bVar20 & 0xf)];
          uVar21 = uVar21 - 1 & uVar21;
        }
        uVar21 = bVar20 - 1 & 0xf;
        *(char *)(pUVar7 + uVar14) = (char)uVar21;
        *(undefined1 *)((long)(pUVar7 + uVar14) + (ulong)uVar21 + 1) = auVar48[0];
        UVar31 = ms->nextToUpdate;
        ms->nextToUpdate = UVar31 + 1;
        pUVar6[uVar14 + uVar21] = UVar31;
        uVar33 = 999999999;
        uVar14 = 3;
        for (lVar37 = 0; lVar39 != lVar37; lVar37 = lVar37 + 1) {
          uVar21 = auStack_b8[lVar37];
          if (uVar21 < uVar35) {
            if (*(int *)(pBVar24 + uVar21) == *pIn) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)(pIn + 1),pBVar24 + (ulong)uVar21 + 4,iEnd,
                                  pBVar24 + uVar35,pBVar17 + uVar35);
              uVar15 = sVar13 + 4;
LAB_001dbba9:
              if ((uVar14 < uVar15) &&
                 (uVar33 = (ulong)((uVar30 + 2) - uVar21), uVar14 = uVar15,
                 (BYTE *)((long)pIn + uVar15) == iEnd)) break;
            }
          }
          else if ((pBVar17 + uVar21)[uVar14] == *(BYTE *)((long)pIn + uVar14)) {
            uVar15 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar21,iEnd);
            goto LAB_001dbba9;
          }
        }
      }
    }
    else if (uVar35 - 6 < 2) {
      pUVar6 = ms->hashTable;
      pUVar7 = ms->tagTable;
      pBVar17 = (ms->window).base;
      pBVar24 = (ms->window).dictBase;
      uVar23 = (ms->window).dictLimit;
      uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar14 = (long)pIn - (long)pBVar17;
      uVar35 = (uint)uVar14;
      bVar19 = 0x38 - (char)ms->rowHashLog;
      for (uVar33 = (ulong)ms->nextToUpdate; uVar33 < (uVar14 & 0xffffffff); uVar33 = uVar33 + 1) {
        uVar36 = (uint)uVar33 & 7;
        uVar32 = ms->hashCache[uVar36];
        ms->hashCache[uVar36] =
             (U32)((ulong)(*(long *)(pBVar17 + uVar33 + 8) * -0x30e4432340650000) >> (bVar19 & 0x3f)
                  );
        uVar15 = (ulong)(uVar32 >> 3 & 0xffffffe0);
        uVar36 = (byte)((char)pUVar7[uVar15] - 1) & 0x1f;
        *(char *)(pUVar7 + uVar15) = (char)uVar36;
        *(char *)((long)pUVar7 + (ulong)uVar36 + 1 + uVar15 * 2) = (char)uVar32;
        pUVar6[uVar15 + uVar36] = (uint)uVar33;
      }
      if (uVar30 < uVar35 - uVar21 && UVar31 == 0) {
        uVar21 = uVar35 - uVar30;
      }
      ms->nextToUpdate = uVar35;
      uVar30 = ms->hashCache[uVar35 & 7];
      ms->hashCache[uVar35 & 7] =
           (U32)((ulong)(*(long *)(pBVar17 + (uVar14 & 0xffffffff) + 8) * -0x30e4432340650000) >>
                (bVar19 & 0x3f));
      uVar14 = (ulong)(uVar30 >> 3 & 0xffffffe0);
      pUVar7 = pUVar7 + uVar14;
      bVar19 = (byte)*pUVar7;
      uVar68 = (undefined1)(uVar30 >> 0x18);
      uVar66 = (undefined1)(uVar30 >> 0x10);
      uVar64 = (undefined1)(uVar30 >> 8);
      auVar70._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar68),uVar66),CONCAT14(uVar66,uVar30)) >> 0x20)
      ;
      auVar70[3] = uVar64;
      auVar70[2] = uVar64;
      auVar70[0] = (byte)uVar30;
      auVar70[1] = auVar70[0];
      auVar70._8_8_ = 0;
      auVar71 = pshuflw(auVar70,auVar70,0);
      bVar20 = auVar71[0];
      auVar40[0] = -(*(byte *)((long)pUVar7 + 1) == bVar20);
      bVar77 = auVar71[1];
      auVar40[1] = -((byte)pUVar7[1] == bVar77);
      bVar78 = auVar71[2];
      auVar40[2] = -(*(byte *)((long)pUVar7 + 3) == bVar78);
      bVar79 = auVar71[3];
      auVar40[3] = -((byte)pUVar7[2] == bVar79);
      auVar40[4] = -(*(byte *)((long)pUVar7 + 5) == bVar20);
      auVar40[5] = -((byte)pUVar7[3] == bVar77);
      auVar40[6] = -(*(byte *)((long)pUVar7 + 7) == bVar78);
      auVar40[7] = -((byte)pUVar7[4] == bVar79);
      auVar40[8] = -(*(byte *)((long)pUVar7 + 9) == bVar20);
      auVar40[9] = -((byte)pUVar7[5] == bVar77);
      auVar40[10] = -(*(byte *)((long)pUVar7 + 0xb) == bVar78);
      auVar40[0xb] = -((byte)pUVar7[6] == bVar79);
      auVar40[0xc] = -(*(byte *)((long)pUVar7 + 0xd) == bVar20);
      auVar40[0xd] = -((byte)pUVar7[7] == bVar77);
      auVar40[0xe] = -(*(byte *)((long)pUVar7 + 0xf) == bVar78);
      auVar40[0xf] = -((byte)pUVar7[8] == bVar79);
      auVar47[0] = -(*(byte *)((long)pUVar7 + 0x11) == bVar20);
      auVar47[1] = -((byte)pUVar7[9] == bVar77);
      auVar47[2] = -(*(byte *)((long)pUVar7 + 0x13) == bVar78);
      auVar47[3] = -((byte)pUVar7[10] == bVar79);
      auVar47[4] = -(*(byte *)((long)pUVar7 + 0x15) == bVar20);
      auVar47[5] = -((byte)pUVar7[0xb] == bVar77);
      auVar47[6] = -(*(byte *)((long)pUVar7 + 0x17) == bVar78);
      auVar47[7] = -((byte)pUVar7[0xc] == bVar79);
      auVar47[8] = -(*(byte *)((long)pUVar7 + 0x19) == bVar20);
      auVar47[9] = -((byte)pUVar7[0xd] == bVar77);
      auVar47[10] = -(*(byte *)((long)pUVar7 + 0x1b) == bVar78);
      auVar47[0xb] = -((byte)pUVar7[0xe] == bVar79);
      auVar47[0xc] = -(*(byte *)((long)pUVar7 + 0x1d) == bVar20);
      auVar47[0xd] = -((byte)pUVar7[0xf] == bVar77);
      auVar47[0xe] = -(*(byte *)((long)pUVar7 + 0x1f) == bVar78);
      auVar47[0xf] = -((byte)pUVar7[0x10] == bVar79);
      uVar32 = CONCAT22((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar47[0xf] >> 7) << 0xf,
                        (ushort)(SUB161(auVar40 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar40[0xf] >> 7) << 0xf);
      uVar30 = uVar32 >> (bVar19 & 0x1f) | uVar32 << 0x20 - (bVar19 & 0x1f);
      if ((bVar19 & 0x1f) == 0) {
        uVar30 = uVar32;
      }
      for (lVar39 = 0; (uVar30 != 0 && ((int)lVar39 != 0x20)); lVar39 = lVar39 + 1) {
        iVar34 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
          }
        }
        if (pUVar6[uVar14 + (iVar34 + (uint)bVar19 & 0x1f)] < uVar21) break;
        auStack_b8[lVar39] = pUVar6[uVar14 + (iVar34 + (uint)bVar19 & 0x1f)];
        uVar30 = uVar30 - 1 & uVar30;
      }
      uVar21 = bVar19 - 1 & 0x1f;
      *(byte *)pUVar7 = (byte)uVar21;
      *(byte *)((long)pUVar7 + (ulong)uVar21 + 1) = auVar70[0];
      UVar31 = ms->nextToUpdate;
      ms->nextToUpdate = UVar31 + 1;
      pUVar6[uVar14 + uVar21] = UVar31;
      uVar33 = 999999999;
      uVar14 = 3;
      for (lVar37 = 0; lVar39 != lVar37; lVar37 = lVar37 + 1) {
        uVar21 = auStack_b8[lVar37];
        if (uVar21 < uVar23) {
          if (*(int *)(pBVar24 + uVar21) == *pIn) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)(pIn + 1),pBVar24 + (ulong)uVar21 + 4,iEnd,pBVar24 + uVar23,
                                pBVar17 + uVar23);
            uVar15 = sVar13 + 4;
LAB_001db19b:
            if ((uVar14 < uVar15) &&
               (uVar33 = (ulong)((uVar35 + 2) - uVar21), uVar14 = uVar15,
               (BYTE *)((long)pIn + uVar15) == iEnd)) break;
          }
        }
        else if ((pBVar17 + uVar21)[uVar14] == *(BYTE *)((long)pIn + uVar14)) {
          uVar15 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar21,iEnd);
          goto LAB_001db19b;
        }
      }
    }
    else if (uVar35 == 5) {
      pUVar6 = ms->hashTable;
      pUVar7 = ms->tagTable;
      pBVar17 = (ms->window).base;
      pBVar24 = (ms->window).dictBase;
      uVar23 = (ms->window).dictLimit;
      uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar14 = (long)pIn - (long)pBVar17;
      uVar35 = (uint)uVar14;
      bVar19 = 0x38 - (char)ms->rowHashLog;
      for (uVar33 = (ulong)ms->nextToUpdate; uVar33 < (uVar14 & 0xffffffff); uVar33 = uVar33 + 1) {
        uVar36 = (uint)uVar33 & 7;
        uVar32 = ms->hashCache[uVar36];
        ms->hashCache[uVar36] =
             (U32)((ulong)(*(long *)(pBVar17 + uVar33 + 8) * -0x30e4432345000000) >> (bVar19 & 0x3f)
                  );
        uVar15 = (ulong)(uVar32 >> 3 & 0xffffffe0);
        uVar36 = (byte)((char)pUVar7[uVar15] - 1) & 0x1f;
        *(char *)(pUVar7 + uVar15) = (char)uVar36;
        *(char *)((long)pUVar7 + (ulong)uVar36 + 1 + uVar15 * 2) = (char)uVar32;
        pUVar6[uVar15 + uVar36] = (uint)uVar33;
      }
      if (uVar30 < uVar35 - uVar21 && UVar31 == 0) {
        uVar21 = uVar35 - uVar30;
      }
      ms->nextToUpdate = uVar35;
      uVar30 = ms->hashCache[uVar35 & 7];
      ms->hashCache[uVar35 & 7] =
           (U32)((ulong)(*(long *)(pBVar17 + (uVar14 & 0xffffffff) + 8) * -0x30e4432345000000) >>
                (bVar19 & 0x3f));
      uVar14 = (ulong)(uVar30 >> 3 & 0xffffffe0);
      pUVar7 = pUVar7 + uVar14;
      bVar19 = (byte)*pUVar7;
      uVar68 = (undefined1)(uVar30 >> 0x18);
      uVar66 = (undefined1)(uVar30 >> 0x10);
      uVar64 = (undefined1)(uVar30 >> 8);
      auVar72._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar68),uVar66),CONCAT14(uVar66,uVar30)) >> 0x20)
      ;
      auVar72[3] = uVar64;
      auVar72[2] = uVar64;
      auVar72[0] = (byte)uVar30;
      auVar72[1] = auVar72[0];
      auVar72._8_8_ = 0;
      auVar71 = pshuflw(auVar72,auVar72,0);
      bVar20 = auVar71[0];
      auVar41[0] = -(*(byte *)((long)pUVar7 + 1) == bVar20);
      bVar77 = auVar71[1];
      auVar41[1] = -((byte)pUVar7[1] == bVar77);
      bVar78 = auVar71[2];
      auVar41[2] = -(*(byte *)((long)pUVar7 + 3) == bVar78);
      bVar79 = auVar71[3];
      auVar41[3] = -((byte)pUVar7[2] == bVar79);
      auVar41[4] = -(*(byte *)((long)pUVar7 + 5) == bVar20);
      auVar41[5] = -((byte)pUVar7[3] == bVar77);
      auVar41[6] = -(*(byte *)((long)pUVar7 + 7) == bVar78);
      auVar41[7] = -((byte)pUVar7[4] == bVar79);
      auVar41[8] = -(*(byte *)((long)pUVar7 + 9) == bVar20);
      auVar41[9] = -((byte)pUVar7[5] == bVar77);
      auVar41[10] = -(*(byte *)((long)pUVar7 + 0xb) == bVar78);
      auVar41[0xb] = -((byte)pUVar7[6] == bVar79);
      auVar41[0xc] = -(*(byte *)((long)pUVar7 + 0xd) == bVar20);
      auVar41[0xd] = -((byte)pUVar7[7] == bVar77);
      auVar41[0xe] = -(*(byte *)((long)pUVar7 + 0xf) == bVar78);
      auVar41[0xf] = -((byte)pUVar7[8] == bVar79);
      auVar50[0] = -(*(byte *)((long)pUVar7 + 0x11) == bVar20);
      auVar50[1] = -((byte)pUVar7[9] == bVar77);
      auVar50[2] = -(*(byte *)((long)pUVar7 + 0x13) == bVar78);
      auVar50[3] = -((byte)pUVar7[10] == bVar79);
      auVar50[4] = -(*(byte *)((long)pUVar7 + 0x15) == bVar20);
      auVar50[5] = -((byte)pUVar7[0xb] == bVar77);
      auVar50[6] = -(*(byte *)((long)pUVar7 + 0x17) == bVar78);
      auVar50[7] = -((byte)pUVar7[0xc] == bVar79);
      auVar50[8] = -(*(byte *)((long)pUVar7 + 0x19) == bVar20);
      auVar50[9] = -((byte)pUVar7[0xd] == bVar77);
      auVar50[10] = -(*(byte *)((long)pUVar7 + 0x1b) == bVar78);
      auVar50[0xb] = -((byte)pUVar7[0xe] == bVar79);
      auVar50[0xc] = -(*(byte *)((long)pUVar7 + 0x1d) == bVar20);
      auVar50[0xd] = -((byte)pUVar7[0xf] == bVar77);
      auVar50[0xe] = -(*(byte *)((long)pUVar7 + 0x1f) == bVar78);
      auVar50[0xf] = -((byte)pUVar7[0x10] == bVar79);
      uVar32 = CONCAT22((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar50[0xf] >> 7) << 0xf,
                        (ushort)(SUB161(auVar41 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar41[0xf] >> 7) << 0xf);
      uVar30 = uVar32 >> (bVar19 & 0x1f) | uVar32 << 0x20 - (bVar19 & 0x1f);
      if ((bVar19 & 0x1f) == 0) {
        uVar30 = uVar32;
      }
      for (lVar39 = 0; (uVar30 != 0 && ((int)lVar39 != 0x20)); lVar39 = lVar39 + 1) {
        iVar34 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
          }
        }
        if (pUVar6[uVar14 + (iVar34 + (uint)bVar19 & 0x1f)] < uVar21) break;
        auStack_b8[lVar39] = pUVar6[uVar14 + (iVar34 + (uint)bVar19 & 0x1f)];
        uVar30 = uVar30 - 1 & uVar30;
      }
      uVar21 = bVar19 - 1 & 0x1f;
      *(byte *)pUVar7 = (byte)uVar21;
      *(byte *)((long)pUVar7 + (ulong)uVar21 + 1) = auVar72[0];
      UVar31 = ms->nextToUpdate;
      ms->nextToUpdate = UVar31 + 1;
      pUVar6[uVar14 + uVar21] = UVar31;
      uVar33 = 999999999;
      uVar14 = 3;
      for (lVar37 = 0; lVar39 != lVar37; lVar37 = lVar37 + 1) {
        uVar21 = auStack_b8[lVar37];
        if (uVar21 < uVar23) {
          if (*(int *)(pBVar24 + uVar21) == *pIn) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)(pIn + 1),pBVar24 + (ulong)uVar21 + 4,iEnd,pBVar24 + uVar23,
                                pBVar17 + uVar23);
            uVar15 = sVar13 + 4;
LAB_001db819:
            if ((uVar14 < uVar15) &&
               (uVar33 = (ulong)((uVar35 + 2) - uVar21), uVar14 = uVar15,
               (BYTE *)((long)pIn + uVar15) == iEnd)) break;
          }
        }
        else if ((pBVar17 + uVar21)[uVar14] == *(BYTE *)((long)pIn + uVar14)) {
          uVar15 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar21,iEnd);
          goto LAB_001db819;
        }
      }
    }
    else {
      pUVar6 = ms->hashTable;
      pUVar7 = ms->tagTable;
      pBVar17 = (ms->window).base;
      pBVar24 = (ms->window).dictBase;
      uVar23 = (ms->window).dictLimit;
      uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar14 = (long)pIn - (long)pBVar17;
      uVar35 = (uint)uVar14;
      bVar19 = 0x18 - (char)ms->rowHashLog;
      for (uVar33 = (ulong)ms->nextToUpdate; uVar33 < (uVar14 & 0xffffffff); uVar33 = uVar33 + 1) {
        uVar36 = (uint)uVar33 & 7;
        uVar32 = ms->hashCache[uVar36];
        ms->hashCache[uVar36] =
             (uint)(*(int *)(pBVar17 + uVar33 + 8) * -0x61c8864f) >> (bVar19 & 0x1f);
        uVar15 = (ulong)(uVar32 >> 3 & 0xffffffe0);
        uVar36 = (byte)((char)pUVar7[uVar15] - 1) & 0x1f;
        *(char *)(pUVar7 + uVar15) = (char)uVar36;
        *(char *)((long)pUVar7 + (ulong)uVar36 + 1 + uVar15 * 2) = (char)uVar32;
        pUVar6[uVar15 + uVar36] = (uint)uVar33;
      }
      if (uVar30 < uVar35 - uVar21 && UVar31 == 0) {
        uVar21 = uVar35 - uVar30;
      }
      ms->nextToUpdate = uVar35;
      uVar30 = ms->hashCache[uVar35 & 7];
      ms->hashCache[uVar35 & 7] =
           (uint)(*(int *)(pBVar17 + (uVar14 & 0xffffffff) + 8) * -0x61c8864f) >> (bVar19 & 0x1f);
      uVar14 = (ulong)(uVar30 >> 3 & 0xffffffe0);
      pUVar7 = pUVar7 + uVar14;
      bVar19 = (byte)*pUVar7;
      uVar68 = (undefined1)(uVar30 >> 0x18);
      uVar66 = (undefined1)(uVar30 >> 0x10);
      uVar64 = (undefined1)(uVar30 >> 8);
      auVar73._4_4_ =
           (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar68),uVar66),CONCAT14(uVar66,uVar30)) >> 0x20)
      ;
      auVar73[3] = uVar64;
      auVar73[2] = uVar64;
      auVar73[0] = (byte)uVar30;
      auVar73[1] = auVar73[0];
      auVar73._8_8_ = 0;
      auVar71 = pshuflw(auVar73,auVar73,0);
      bVar20 = auVar71[0];
      auVar42[0] = -(*(byte *)((long)pUVar7 + 1) == bVar20);
      bVar77 = auVar71[1];
      auVar42[1] = -((byte)pUVar7[1] == bVar77);
      bVar78 = auVar71[2];
      auVar42[2] = -(*(byte *)((long)pUVar7 + 3) == bVar78);
      bVar79 = auVar71[3];
      auVar42[3] = -((byte)pUVar7[2] == bVar79);
      auVar42[4] = -(*(byte *)((long)pUVar7 + 5) == bVar20);
      auVar42[5] = -((byte)pUVar7[3] == bVar77);
      auVar42[6] = -(*(byte *)((long)pUVar7 + 7) == bVar78);
      auVar42[7] = -((byte)pUVar7[4] == bVar79);
      auVar42[8] = -(*(byte *)((long)pUVar7 + 9) == bVar20);
      auVar42[9] = -((byte)pUVar7[5] == bVar77);
      auVar42[10] = -(*(byte *)((long)pUVar7 + 0xb) == bVar78);
      auVar42[0xb] = -((byte)pUVar7[6] == bVar79);
      auVar42[0xc] = -(*(byte *)((long)pUVar7 + 0xd) == bVar20);
      auVar42[0xd] = -((byte)pUVar7[7] == bVar77);
      auVar42[0xe] = -(*(byte *)((long)pUVar7 + 0xf) == bVar78);
      auVar42[0xf] = -((byte)pUVar7[8] == bVar79);
      auVar53[0] = -(*(byte *)((long)pUVar7 + 0x11) == bVar20);
      auVar53[1] = -((byte)pUVar7[9] == bVar77);
      auVar53[2] = -(*(byte *)((long)pUVar7 + 0x13) == bVar78);
      auVar53[3] = -((byte)pUVar7[10] == bVar79);
      auVar53[4] = -(*(byte *)((long)pUVar7 + 0x15) == bVar20);
      auVar53[5] = -((byte)pUVar7[0xb] == bVar77);
      auVar53[6] = -(*(byte *)((long)pUVar7 + 0x17) == bVar78);
      auVar53[7] = -((byte)pUVar7[0xc] == bVar79);
      auVar53[8] = -(*(byte *)((long)pUVar7 + 0x19) == bVar20);
      auVar53[9] = -((byte)pUVar7[0xd] == bVar77);
      auVar53[10] = -(*(byte *)((long)pUVar7 + 0x1b) == bVar78);
      auVar53[0xb] = -((byte)pUVar7[0xe] == bVar79);
      auVar53[0xc] = -(*(byte *)((long)pUVar7 + 0x1d) == bVar20);
      auVar53[0xd] = -((byte)pUVar7[0xf] == bVar77);
      auVar53[0xe] = -(*(byte *)((long)pUVar7 + 0x1f) == bVar78);
      auVar53[0xf] = -((byte)pUVar7[0x10] == bVar79);
      uVar32 = CONCAT22((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar53[0xf] >> 7) << 0xf,
                        (ushort)(SUB161(auVar42 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar42[0xf] >> 7) << 0xf);
      uVar30 = uVar32 >> (bVar19 & 0x1f) | uVar32 << 0x20 - (bVar19 & 0x1f);
      if ((bVar19 & 0x1f) == 0) {
        uVar30 = uVar32;
      }
      for (lVar39 = 0; (uVar30 != 0 && ((int)lVar39 != 0x20)); lVar39 = lVar39 + 1) {
        iVar34 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
          }
        }
        if (pUVar6[uVar14 + (iVar34 + (uint)bVar19 & 0x1f)] < uVar21) break;
        auStack_b8[lVar39] = pUVar6[uVar14 + (iVar34 + (uint)bVar19 & 0x1f)];
        uVar30 = uVar30 - 1 & uVar30;
      }
      uVar21 = bVar19 - 1 & 0x1f;
      *(byte *)pUVar7 = (byte)uVar21;
      *(byte *)((long)pUVar7 + (ulong)uVar21 + 1) = auVar73[0];
      UVar31 = ms->nextToUpdate;
      ms->nextToUpdate = UVar31 + 1;
      pUVar6[uVar14 + uVar21] = UVar31;
      uVar33 = 999999999;
      uVar14 = 3;
      for (lVar37 = 0; lVar39 != lVar37; lVar37 = lVar37 + 1) {
        uVar21 = auStack_b8[lVar37];
        if (uVar21 < uVar23) {
          if (*(int *)(pBVar24 + uVar21) == *pIn) {
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)(pIn + 1),pBVar24 + (ulong)uVar21 + 4,iEnd,pBVar24 + uVar23,
                                pBVar17 + uVar23);
            uVar15 = sVar13 + 4;
LAB_001dbac8:
            if ((uVar14 < uVar15) &&
               (uVar33 = (ulong)((uVar35 + 2) - uVar21), uVar14 = uVar15,
               (BYTE *)((long)pIn + uVar15) == iEnd)) break;
          }
        }
        else if ((pBVar17 + uVar21)[uVar14] == *(BYTE *)((long)pIn + uVar14)) {
          uVar15 = ZSTD_count((BYTE *)pIn,pBVar17 + uVar21,iEnd);
          goto LAB_001dbac8;
        }
      }
    }
    uVar15 = uVar12;
    if (uVar12 < uVar14) {
      uVar15 = uVar14;
    }
    if (3 < uVar15) {
      piVar38 = pIn;
      if (uVar14 <= uVar12) {
        uVar33 = 0;
        piVar38 = (int *)((long)pIn + 1);
      }
      do {
        uVar14 = uVar33;
        uVar12 = uVar15;
        local_130 = piVar38;
        if (iLimit <= pIn) break;
        piVar38 = (int *)((long)pIn + 1);
        iVar27 = iVar27 + 1;
        if (uVar14 == 0) {
          uVar14 = 0;
        }
        else {
          UVar31 = (ms->window).lowLimit;
          UVar22 = iVar27 - uVar10;
          if (iVar27 - UVar31 <= uVar10) {
            UVar22 = UVar31;
          }
          if (ms->loadedDictEnd != 0) {
            UVar22 = UVar31;
          }
          uVar21 = iVar27 - local_14c;
          pBVar17 = base;
          if (uVar21 < uVar3) {
            pBVar17 = pBVar5;
          }
          if (((2 < iVar11 - uVar21) && (local_14c < iVar27 - UVar22)) &&
             (*piVar38 == *(int *)(pBVar17 + uVar21))) {
            pBVar24 = iEnd;
            if (uVar21 < uVar3) {
              pBVar24 = pBVar25;
            }
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)((long)pIn + 5),(BYTE *)((long)(pBVar17 + uVar21) + 4),iEnd,
                                pBVar24,iStart);
            if (sVar13 < 0xfffffffffffffffc) {
              uVar23 = (int)uVar14 + 1;
              uVar21 = 0x1f;
              if (uVar23 != 0) {
                for (; uVar23 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                }
              }
              if ((int)((uVar21 ^ 0x1f) + (int)uVar12 * 3 + -0x1e) < (int)(sVar13 + 4) * 3) {
                uVar14 = 0;
                uVar12 = sVar13 + 4;
                local_130 = piVar38;
              }
            }
          }
        }
        uVar21 = (ms->cParams).searchLog;
        uVar23 = (ms->cParams).minMatch;
        if (uVar21 < 5) {
          bVar19 = (byte)uVar21;
          if (uVar23 - 6 < 2) {
            pUVar6 = ms->hashTable;
            pUVar7 = ms->tagTable;
            pBVar17 = (ms->window).base;
            uVar33 = (long)piVar38 - (long)pBVar17;
            uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar21 = (ms->window).lowLimit;
            uVar30 = (uint)uVar33;
            uVar23 = uVar30 - uVar35;
            if (uVar30 - uVar21 <= uVar35) {
              uVar23 = uVar21;
            }
            pBVar24 = (ms->window).dictBase;
            uVar35 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar23 = uVar21;
            }
            bVar20 = 0x38 - (char)ms->rowHashLog;
            for (uVar15 = (ulong)ms->nextToUpdate; uVar15 < (uVar33 & 0xffffffff);
                uVar15 = uVar15 + 1) {
              uVar32 = (uint)uVar15 & 7;
              uVar21 = ms->hashCache[uVar32];
              ms->hashCache[uVar32] =
                   (U32)((ulong)(*(long *)(pBVar17 + uVar15 + 8) * -0x30e4432340650000) >>
                        (bVar20 & 0x3f));
              uVar29 = (ulong)(uVar21 >> 4 & 0xffffff0);
              uVar32 = (byte)((char)pUVar7[uVar29] - 1) & 0xf;
              *(char *)(pUVar7 + uVar29) = (char)uVar32;
              *(char *)((long)pUVar7 + (ulong)uVar32 + 1 + uVar29 * 2) = (char)uVar21;
              pUVar6[uVar29 + uVar32] = (uint)uVar15;
            }
            ms->nextToUpdate = uVar30;
            uVar21 = ms->hashCache[uVar30 & 7];
            ms->hashCache[uVar30 & 7] =
                 (U32)((ulong)(*(long *)(pBVar17 + (uVar33 & 0xffffffff) + 8) * -0x30e4432340650000)
                      >> (bVar20 & 0x3f));
            uVar33 = (ulong)(uVar21 >> 4 & 0xfffffff0);
            bVar20 = (byte)pUVar7[uVar33];
            pcVar1 = (char *)((long)pUVar7 + uVar33 * 2 + 1);
            uVar68 = (undefined1)(uVar21 >> 0x18);
            uVar66 = (undefined1)(uVar21 >> 0x10);
            uVar64 = (undefined1)(uVar21 >> 8);
            auVar56._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar68),uVar66),CONCAT14(uVar66,uVar21)) >>
                      0x20);
            auVar56[3] = uVar64;
            auVar56[2] = uVar64;
            auVar56[0] = (undefined1)uVar21;
            auVar56[1] = auVar56[0];
            auVar56._8_8_ = 0;
            auVar71 = pshuflw(auVar56,auVar56,0);
            cVar46 = auVar71[0];
            auVar57[0] = -(cVar46 == *pcVar1);
            cVar65 = auVar71[1];
            auVar57[1] = -(cVar65 == pcVar1[1]);
            cVar67 = auVar71[2];
            auVar57[2] = -(cVar67 == pcVar1[2]);
            cVar69 = auVar71[3];
            auVar57[3] = -(cVar69 == pcVar1[3]);
            auVar57[4] = -(cVar46 == pcVar1[4]);
            auVar57[5] = -(cVar65 == pcVar1[5]);
            auVar57[6] = -(cVar67 == pcVar1[6]);
            auVar57[7] = -(cVar69 == pcVar1[7]);
            auVar57[8] = -(cVar46 == pcVar1[8]);
            auVar57[9] = -(cVar65 == pcVar1[9]);
            auVar57[10] = -(cVar67 == pcVar1[10]);
            auVar57[0xb] = -(cVar69 == pcVar1[0xb]);
            auVar57[0xc] = -(cVar46 == pcVar1[0xc]);
            auVar57[0xd] = -(cVar65 == pcVar1[0xd]);
            auVar57[0xe] = -(cVar67 == pcVar1[0xe]);
            auVar57[0xf] = -(cVar69 == pcVar1[0xf]);
            uVar8 = (ushort)(SUB161(auVar57 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar57[0xf] >> 7) << 0xf;
            uVar21 = (uint)uVar8;
            if ((bVar20 & 0xf) != 0) {
              uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                       (uint)(uVar8 >> (bVar20 & 0xf));
            }
            for (lVar39 = 0; (uVar21 != 0 && ((int)(1L << (bVar19 & 0x3f)) != (int)lVar39));
                lVar39 = lVar39 + 1) {
              iVar34 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
                }
              }
              if (pUVar6[uVar33 + (iVar34 + (uint)bVar20 & 0xf)] < uVar23) break;
              auStack_b8[lVar39] = pUVar6[uVar33 + (iVar34 + (uint)bVar20 & 0xf)];
              uVar21 = uVar21 - 1 & uVar21;
            }
            uVar21 = bVar20 - 1 & 0xf;
            *(char *)(pUVar7 + uVar33) = (char)uVar21;
            *(undefined1 *)((long)(pUVar7 + uVar33) + (ulong)uVar21 + 1) = auVar56[0];
            UVar31 = ms->nextToUpdate;
            ms->nextToUpdate = UVar31 + 1;
            pUVar6[uVar33 + uVar21] = UVar31;
            uVar33 = 999999999;
            uVar15 = 3;
            for (lVar37 = 0; lVar39 != lVar37; lVar37 = lVar37 + 1) {
              uVar21 = auStack_b8[lVar37];
              if (uVar21 < uVar35) {
                if (*(int *)(pBVar24 + uVar21) == *piVar38) {
                  sVar13 = ZSTD_count_2segments
                                     ((BYTE *)((long)pIn + 5),pBVar24 + (ulong)uVar21 + 4,iEnd,
                                      pBVar24 + uVar35,pBVar17 + uVar35);
                  sVar13 = sVar13 + 4;
LAB_001dc4ef:
                  if ((uVar15 < sVar13) &&
                     (uVar33 = (ulong)((uVar30 + 2) - uVar21), uVar15 = sVar13,
                     (BYTE *)((long)piVar38 + sVar13) == iEnd)) break;
                }
              }
              else if ((pBVar17 + uVar21)[uVar15] == *(BYTE *)((long)piVar38 + uVar15)) {
                sVar13 = ZSTD_count((BYTE *)piVar38,pBVar17 + uVar21,iEnd);
                goto LAB_001dc4ef;
              }
            }
          }
          else if (uVar23 == 5) {
            pUVar6 = ms->hashTable;
            pUVar7 = ms->tagTable;
            pBVar17 = (ms->window).base;
            uVar33 = (long)piVar38 - (long)pBVar17;
            uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar21 = (ms->window).lowLimit;
            uVar30 = (uint)uVar33;
            uVar23 = uVar30 - uVar35;
            if (uVar30 - uVar21 <= uVar35) {
              uVar23 = uVar21;
            }
            pBVar24 = (ms->window).dictBase;
            uVar35 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar23 = uVar21;
            }
            bVar20 = 0x38 - (char)ms->rowHashLog;
            for (uVar15 = (ulong)ms->nextToUpdate; uVar15 < (uVar33 & 0xffffffff);
                uVar15 = uVar15 + 1) {
              uVar32 = (uint)uVar15 & 7;
              uVar21 = ms->hashCache[uVar32];
              ms->hashCache[uVar32] =
                   (U32)((ulong)(*(long *)(pBVar17 + uVar15 + 8) * -0x30e4432345000000) >>
                        (bVar20 & 0x3f));
              uVar29 = (ulong)(uVar21 >> 4 & 0xffffff0);
              uVar32 = (byte)((char)pUVar7[uVar29] - 1) & 0xf;
              *(char *)(pUVar7 + uVar29) = (char)uVar32;
              *(char *)((long)pUVar7 + (ulong)uVar32 + 1 + uVar29 * 2) = (char)uVar21;
              pUVar6[uVar29 + uVar32] = (uint)uVar15;
            }
            ms->nextToUpdate = uVar30;
            uVar21 = ms->hashCache[uVar30 & 7];
            ms->hashCache[uVar30 & 7] =
                 (U32)((ulong)(*(long *)(pBVar17 + (uVar33 & 0xffffffff) + 8) * -0x30e4432345000000)
                      >> (bVar20 & 0x3f));
            uVar33 = (ulong)(uVar21 >> 4 & 0xfffffff0);
            bVar20 = (byte)pUVar7[uVar33];
            pcVar1 = (char *)((long)pUVar7 + uVar33 * 2 + 1);
            uVar68 = (undefined1)(uVar21 >> 0x18);
            uVar66 = (undefined1)(uVar21 >> 0x10);
            uVar64 = (undefined1)(uVar21 >> 8);
            auVar59._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar68),uVar66),CONCAT14(uVar66,uVar21)) >>
                      0x20);
            auVar59[3] = uVar64;
            auVar59[2] = uVar64;
            auVar59[0] = (undefined1)uVar21;
            auVar59[1] = auVar59[0];
            auVar59._8_8_ = 0;
            auVar71 = pshuflw(auVar59,auVar59,0);
            cVar46 = auVar71[0];
            auVar60[0] = -(cVar46 == *pcVar1);
            cVar65 = auVar71[1];
            auVar60[1] = -(cVar65 == pcVar1[1]);
            cVar67 = auVar71[2];
            auVar60[2] = -(cVar67 == pcVar1[2]);
            cVar69 = auVar71[3];
            auVar60[3] = -(cVar69 == pcVar1[3]);
            auVar60[4] = -(cVar46 == pcVar1[4]);
            auVar60[5] = -(cVar65 == pcVar1[5]);
            auVar60[6] = -(cVar67 == pcVar1[6]);
            auVar60[7] = -(cVar69 == pcVar1[7]);
            auVar60[8] = -(cVar46 == pcVar1[8]);
            auVar60[9] = -(cVar65 == pcVar1[9]);
            auVar60[10] = -(cVar67 == pcVar1[10]);
            auVar60[0xb] = -(cVar69 == pcVar1[0xb]);
            auVar60[0xc] = -(cVar46 == pcVar1[0xc]);
            auVar60[0xd] = -(cVar65 == pcVar1[0xd]);
            auVar60[0xe] = -(cVar67 == pcVar1[0xe]);
            auVar60[0xf] = -(cVar69 == pcVar1[0xf]);
            uVar8 = (ushort)(SUB161(auVar60 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar60[0xf] >> 7) << 0xf;
            uVar21 = (uint)uVar8;
            if ((bVar20 & 0xf) != 0) {
              uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                       (uint)(uVar8 >> (bVar20 & 0xf));
            }
            for (lVar39 = 0; (uVar21 != 0 && (1 << (bVar19 & 0x1f) != (int)lVar39));
                lVar39 = lVar39 + 1) {
              iVar34 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
                }
              }
              if (pUVar6[uVar33 + (iVar34 + (uint)bVar20 & 0xf)] < uVar23) break;
              auStack_b8[lVar39] = pUVar6[uVar33 + (iVar34 + (uint)bVar20 & 0xf)];
              uVar21 = uVar21 - 1 & uVar21;
            }
            uVar21 = bVar20 - 1 & 0xf;
            *(char *)(pUVar7 + uVar33) = (char)uVar21;
            *(undefined1 *)((long)(pUVar7 + uVar33) + (ulong)uVar21 + 1) = auVar59[0];
            UVar31 = ms->nextToUpdate;
            ms->nextToUpdate = UVar31 + 1;
            pUVar6[uVar33 + uVar21] = UVar31;
            uVar33 = 999999999;
            uVar15 = 3;
            for (lVar37 = 0; lVar39 != lVar37; lVar37 = lVar37 + 1) {
              uVar21 = auStack_b8[lVar37];
              if (uVar21 < uVar35) {
                if (*(int *)(pBVar24 + uVar21) == *piVar38) {
                  sVar13 = ZSTD_count_2segments
                                     ((BYTE *)((long)pIn + 5),pBVar24 + (ulong)uVar21 + 4,iEnd,
                                      pBVar24 + uVar35,pBVar17 + uVar35);
                  sVar13 = sVar13 + 4;
LAB_001dcc96:
                  if ((uVar15 < sVar13) &&
                     (uVar33 = (ulong)((uVar30 + 2) - uVar21), uVar15 = sVar13,
                     (BYTE *)((long)piVar38 + sVar13) == iEnd)) break;
                }
              }
              else if ((pBVar17 + uVar21)[uVar15] == *(BYTE *)((long)piVar38 + uVar15)) {
                sVar13 = ZSTD_count((BYTE *)piVar38,pBVar17 + uVar21,iEnd);
                goto LAB_001dcc96;
              }
            }
          }
          else {
            pUVar6 = ms->hashTable;
            pUVar7 = ms->tagTable;
            pBVar17 = (ms->window).base;
            uVar33 = (long)piVar38 - (long)pBVar17;
            uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar21 = (ms->window).lowLimit;
            uVar30 = (uint)uVar33;
            uVar23 = uVar30 - uVar35;
            if (uVar30 - uVar21 <= uVar35) {
              uVar23 = uVar21;
            }
            pBVar24 = (ms->window).dictBase;
            uVar35 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar23 = uVar21;
            }
            bVar20 = 0x18 - (char)ms->rowHashLog;
            for (uVar15 = (ulong)ms->nextToUpdate; uVar15 < (uVar33 & 0xffffffff);
                uVar15 = uVar15 + 1) {
              uVar32 = (uint)uVar15 & 7;
              uVar21 = ms->hashCache[uVar32];
              ms->hashCache[uVar32] =
                   (uint)(*(int *)(pBVar17 + uVar15 + 8) * -0x61c8864f) >> (bVar20 & 0x1f);
              uVar29 = (ulong)(uVar21 >> 4 & 0xffffff0);
              uVar32 = (byte)((char)pUVar7[uVar29] - 1) & 0xf;
              *(char *)(pUVar7 + uVar29) = (char)uVar32;
              *(char *)((long)pUVar7 + (ulong)uVar32 + 1 + uVar29 * 2) = (char)uVar21;
              pUVar6[uVar29 + uVar32] = (uint)uVar15;
            }
            ms->nextToUpdate = uVar30;
            uVar21 = ms->hashCache[uVar30 & 7];
            ms->hashCache[uVar30 & 7] =
                 (uint)(*(int *)(pBVar17 + (uVar33 & 0xffffffff) + 8) * -0x61c8864f) >>
                 (bVar20 & 0x1f);
            uVar33 = (ulong)(uVar21 >> 4 & 0xfffffff0);
            bVar20 = (byte)pUVar7[uVar33];
            pcVar1 = (char *)((long)pUVar7 + uVar33 * 2 + 1);
            uVar68 = (undefined1)(uVar21 >> 0x18);
            uVar66 = (undefined1)(uVar21 >> 0x10);
            uVar64 = (undefined1)(uVar21 >> 8);
            auVar62._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar68),uVar66),CONCAT14(uVar66,uVar21)) >>
                      0x20);
            auVar62[3] = uVar64;
            auVar62[2] = uVar64;
            auVar62[0] = (undefined1)uVar21;
            auVar62[1] = auVar62[0];
            auVar62._8_8_ = 0;
            auVar71 = pshuflw(auVar62,auVar62,0);
            cVar46 = auVar71[0];
            auVar63[0] = -(cVar46 == *pcVar1);
            cVar65 = auVar71[1];
            auVar63[1] = -(cVar65 == pcVar1[1]);
            cVar67 = auVar71[2];
            auVar63[2] = -(cVar67 == pcVar1[2]);
            cVar69 = auVar71[3];
            auVar63[3] = -(cVar69 == pcVar1[3]);
            auVar63[4] = -(cVar46 == pcVar1[4]);
            auVar63[5] = -(cVar65 == pcVar1[5]);
            auVar63[6] = -(cVar67 == pcVar1[6]);
            auVar63[7] = -(cVar69 == pcVar1[7]);
            auVar63[8] = -(cVar46 == pcVar1[8]);
            auVar63[9] = -(cVar65 == pcVar1[9]);
            auVar63[10] = -(cVar67 == pcVar1[10]);
            auVar63[0xb] = -(cVar69 == pcVar1[0xb]);
            auVar63[0xc] = -(cVar46 == pcVar1[0xc]);
            auVar63[0xd] = -(cVar65 == pcVar1[0xd]);
            auVar63[0xe] = -(cVar67 == pcVar1[0xe]);
            auVar63[0xf] = -(cVar69 == pcVar1[0xf]);
            uVar8 = (ushort)(SUB161(auVar63 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar63[0xf] >> 7) << 0xf;
            uVar21 = (uint)uVar8;
            if ((bVar20 & 0xf) != 0) {
              uVar21 = (uint)uVar8 << (0x10 - (bVar20 & 0xf) & 0x1f) & 0xfffe |
                       (uint)(uVar8 >> (bVar20 & 0xf));
            }
            for (lVar39 = 0; (uVar21 != 0 && ((int)(1L << (bVar19 & 0x3f)) != (int)lVar39));
                lVar39 = lVar39 + 1) {
              iVar34 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
                }
              }
              if (pUVar6[uVar33 + (iVar34 + (uint)bVar20 & 0xf)] < uVar23) break;
              auStack_b8[lVar39] = pUVar6[uVar33 + (iVar34 + (uint)bVar20 & 0xf)];
              uVar21 = uVar21 - 1 & uVar21;
            }
            uVar21 = bVar20 - 1 & 0xf;
            *(char *)(pUVar7 + uVar33) = (char)uVar21;
            *(undefined1 *)((long)(pUVar7 + uVar33) + (ulong)uVar21 + 1) = auVar62[0];
            UVar31 = ms->nextToUpdate;
            ms->nextToUpdate = UVar31 + 1;
            pUVar6[uVar33 + uVar21] = UVar31;
            uVar33 = 999999999;
            uVar15 = 3;
            for (lVar37 = 0; lVar39 != lVar37; lVar37 = lVar37 + 1) {
              uVar21 = auStack_b8[lVar37];
              if (uVar21 < uVar35) {
                if (*(int *)(pBVar24 + uVar21) == *piVar38) {
                  sVar13 = ZSTD_count_2segments
                                     ((BYTE *)((long)pIn + 5),pBVar24 + (ulong)uVar21 + 4,iEnd,
                                      pBVar24 + uVar35,pBVar17 + uVar35);
                  sVar13 = sVar13 + 4;
LAB_001dce77:
                  if ((uVar15 < sVar13) &&
                     (uVar33 = (ulong)((uVar30 + 2) - uVar21), uVar15 = sVar13,
                     (BYTE *)((long)piVar38 + sVar13) == iEnd)) break;
                }
              }
              else if ((pBVar17 + uVar21)[uVar15] == *(BYTE *)((long)piVar38 + uVar15)) {
                sVar13 = ZSTD_count((BYTE *)piVar38,pBVar17 + uVar21,iEnd);
                goto LAB_001dce77;
              }
            }
          }
        }
        else if (uVar23 - 6 < 2) {
          pUVar6 = ms->hashTable;
          pUVar7 = ms->tagTable;
          pBVar17 = (ms->window).base;
          pBVar24 = (ms->window).dictBase;
          uVar21 = (ms->window).dictLimit;
          uVar33 = (long)piVar38 - (long)pBVar17;
          uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar23 = (ms->window).lowLimit;
          uVar35 = (uint)uVar33;
          UVar31 = ms->loadedDictEnd;
          bVar19 = 0x38 - (char)ms->rowHashLog;
          for (uVar15 = (ulong)ms->nextToUpdate; uVar15 < (uVar33 & 0xffffffff); uVar15 = uVar15 + 1
              ) {
            uVar36 = (uint)uVar15 & 7;
            uVar32 = ms->hashCache[uVar36];
            ms->hashCache[uVar36] =
                 (U32)((ulong)(*(long *)(pBVar17 + uVar15 + 8) * -0x30e4432340650000) >>
                      (bVar19 & 0x3f));
            uVar29 = (ulong)(uVar32 >> 3 & 0x1fffffe0);
            uVar36 = (byte)((char)pUVar7[uVar29] - 1) & 0x1f;
            *(char *)(pUVar7 + uVar29) = (char)uVar36;
            *(char *)((long)pUVar7 + (ulong)uVar36 + 1 + uVar29 * 2) = (char)uVar32;
            pUVar6[uVar29 + uVar36] = (uint)uVar15;
          }
          if (UVar31 == 0 && uVar30 < uVar35 - uVar23) {
            uVar23 = uVar35 - uVar30;
          }
          ms->nextToUpdate = uVar35;
          uVar30 = ms->hashCache[uVar35 & 7];
          ms->hashCache[uVar35 & 7] =
               (U32)((ulong)(*(long *)(pBVar17 + (uVar33 & 0xffffffff) + 8) * -0x30e4432340650000)
                    >> (bVar19 & 0x3f));
          uVar33 = (ulong)(uVar30 >> 3 & 0xffffffe0);
          pUVar7 = pUVar7 + uVar33;
          bVar19 = (byte)*pUVar7;
          uVar68 = (undefined1)(uVar30 >> 0x18);
          uVar66 = (undefined1)(uVar30 >> 0x10);
          uVar64 = (undefined1)(uVar30 >> 8);
          auVar74._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar68),uVar66),CONCAT14(uVar66,uVar30)) >>
                    0x20);
          auVar74[3] = uVar64;
          auVar74[2] = uVar64;
          auVar74[0] = (byte)uVar30;
          auVar74[1] = auVar74[0];
          auVar74._8_8_ = 0;
          auVar71 = pshuflw(auVar74,auVar74,0);
          bVar20 = auVar71[0];
          auVar43[0] = -(*(byte *)((long)pUVar7 + 1) == bVar20);
          bVar77 = auVar71[1];
          auVar43[1] = -((byte)pUVar7[1] == bVar77);
          bVar78 = auVar71[2];
          auVar43[2] = -(*(byte *)((long)pUVar7 + 3) == bVar78);
          bVar79 = auVar71[3];
          auVar43[3] = -((byte)pUVar7[2] == bVar79);
          auVar43[4] = -(*(byte *)((long)pUVar7 + 5) == bVar20);
          auVar43[5] = -((byte)pUVar7[3] == bVar77);
          auVar43[6] = -(*(byte *)((long)pUVar7 + 7) == bVar78);
          auVar43[7] = -((byte)pUVar7[4] == bVar79);
          auVar43[8] = -(*(byte *)((long)pUVar7 + 9) == bVar20);
          auVar43[9] = -((byte)pUVar7[5] == bVar77);
          auVar43[10] = -(*(byte *)((long)pUVar7 + 0xb) == bVar78);
          auVar43[0xb] = -((byte)pUVar7[6] == bVar79);
          auVar43[0xc] = -(*(byte *)((long)pUVar7 + 0xd) == bVar20);
          auVar43[0xd] = -((byte)pUVar7[7] == bVar77);
          auVar43[0xe] = -(*(byte *)((long)pUVar7 + 0xf) == bVar78);
          auVar43[0xf] = -((byte)pUVar7[8] == bVar79);
          auVar55[0] = -(*(byte *)((long)pUVar7 + 0x11) == bVar20);
          auVar55[1] = -((byte)pUVar7[9] == bVar77);
          auVar55[2] = -(*(byte *)((long)pUVar7 + 0x13) == bVar78);
          auVar55[3] = -((byte)pUVar7[10] == bVar79);
          auVar55[4] = -(*(byte *)((long)pUVar7 + 0x15) == bVar20);
          auVar55[5] = -((byte)pUVar7[0xb] == bVar77);
          auVar55[6] = -(*(byte *)((long)pUVar7 + 0x17) == bVar78);
          auVar55[7] = -((byte)pUVar7[0xc] == bVar79);
          auVar55[8] = -(*(byte *)((long)pUVar7 + 0x19) == bVar20);
          auVar55[9] = -((byte)pUVar7[0xd] == bVar77);
          auVar55[10] = -(*(byte *)((long)pUVar7 + 0x1b) == bVar78);
          auVar55[0xb] = -((byte)pUVar7[0xe] == bVar79);
          auVar55[0xc] = -(*(byte *)((long)pUVar7 + 0x1d) == bVar20);
          auVar55[0xd] = -((byte)pUVar7[0xf] == bVar77);
          auVar55[0xe] = -(*(byte *)((long)pUVar7 + 0x1f) == bVar78);
          auVar55[0xf] = -((byte)pUVar7[0x10] == bVar79);
          uVar32 = CONCAT22((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar55[0xf] >> 7) << 0xf,
                            (ushort)(SUB161(auVar43 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar43[0xf] >> 7) << 0xf);
          uVar30 = uVar32 >> (bVar19 & 0x1f) | uVar32 << 0x20 - (bVar19 & 0x1f);
          if ((bVar19 & 0x1f) == 0) {
            uVar30 = uVar32;
          }
          for (lVar39 = 0; (uVar30 != 0 && ((int)lVar39 != 0x20)); lVar39 = lVar39 + 1) {
            iVar34 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
              }
            }
            if (pUVar6[uVar33 + (iVar34 + (uint)bVar19 & 0x1f)] < uVar23) break;
            auStack_b8[lVar39] = pUVar6[uVar33 + (iVar34 + (uint)bVar19 & 0x1f)];
            uVar30 = uVar30 - 1 & uVar30;
          }
          uVar23 = bVar19 - 1 & 0x1f;
          *(byte *)pUVar7 = (byte)uVar23;
          *(byte *)((long)pUVar7 + (ulong)uVar23 + 1) = auVar74[0];
          UVar31 = ms->nextToUpdate;
          ms->nextToUpdate = UVar31 + 1;
          pUVar6[uVar33 + uVar23] = UVar31;
          uVar33 = 999999999;
          uVar15 = 3;
          for (lVar37 = 0; lVar39 != lVar37; lVar37 = lVar37 + 1) {
            uVar23 = auStack_b8[lVar37];
            if (uVar23 < uVar21) {
              if (*(int *)(pBVar24 + uVar23) == *piVar38) {
                sVar13 = ZSTD_count_2segments
                                   ((BYTE *)((long)pIn + 5),pBVar24 + (ulong)uVar23 + 4,iEnd,
                                    pBVar24 + uVar21,pBVar17 + uVar21);
                sVar13 = sVar13 + 4;
LAB_001dc403:
                if ((uVar15 < sVar13) &&
                   (uVar33 = (ulong)((uVar35 + 2) - uVar23), uVar15 = sVar13,
                   (BYTE *)((long)piVar38 + sVar13) == iEnd)) break;
              }
            }
            else if ((pBVar17 + uVar23)[uVar15] == *(BYTE *)((long)piVar38 + uVar15)) {
              sVar13 = ZSTD_count((BYTE *)piVar38,pBVar17 + uVar23,iEnd);
              goto LAB_001dc403;
            }
          }
        }
        else if (uVar23 == 5) {
          pUVar6 = ms->hashTable;
          pUVar7 = ms->tagTable;
          pBVar17 = (ms->window).base;
          pBVar24 = (ms->window).dictBase;
          uVar21 = (ms->window).dictLimit;
          uVar33 = (long)piVar38 - (long)pBVar17;
          uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar23 = (ms->window).lowLimit;
          uVar35 = (uint)uVar33;
          UVar31 = ms->loadedDictEnd;
          bVar19 = 0x38 - (char)ms->rowHashLog;
          for (uVar15 = (ulong)ms->nextToUpdate; uVar15 < (uVar33 & 0xffffffff); uVar15 = uVar15 + 1
              ) {
            uVar36 = (uint)uVar15 & 7;
            uVar32 = ms->hashCache[uVar36];
            ms->hashCache[uVar36] =
                 (U32)((ulong)(*(long *)(pBVar17 + uVar15 + 8) * -0x30e4432345000000) >>
                      (bVar19 & 0x3f));
            uVar29 = (ulong)(uVar32 >> 3 & 0x1fffffe0);
            uVar36 = (byte)((char)pUVar7[uVar29] - 1) & 0x1f;
            *(char *)(pUVar7 + uVar29) = (char)uVar36;
            *(char *)((long)pUVar7 + (ulong)uVar36 + 1 + uVar29 * 2) = (char)uVar32;
            pUVar6[uVar29 + uVar36] = (uint)uVar15;
          }
          if (UVar31 == 0 && uVar30 < uVar35 - uVar23) {
            uVar23 = uVar35 - uVar30;
          }
          ms->nextToUpdate = uVar35;
          uVar30 = ms->hashCache[uVar35 & 7];
          ms->hashCache[uVar35 & 7] =
               (U32)((ulong)(*(long *)(pBVar17 + (uVar33 & 0xffffffff) + 8) * -0x30e4432345000000)
                    >> (bVar19 & 0x3f));
          uVar33 = (ulong)(uVar30 >> 3 & 0xffffffe0);
          pUVar7 = pUVar7 + uVar33;
          bVar19 = (byte)*pUVar7;
          uVar68 = (undefined1)(uVar30 >> 0x18);
          uVar66 = (undefined1)(uVar30 >> 0x10);
          uVar64 = (undefined1)(uVar30 >> 8);
          auVar75._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar68),uVar66),CONCAT14(uVar66,uVar30)) >>
                    0x20);
          auVar75[3] = uVar64;
          auVar75[2] = uVar64;
          auVar75[0] = (byte)uVar30;
          auVar75[1] = auVar75[0];
          auVar75._8_8_ = 0;
          auVar71 = pshuflw(auVar75,auVar75,0);
          bVar20 = auVar71[0];
          auVar44[0] = -(*(byte *)((long)pUVar7 + 1) == bVar20);
          bVar77 = auVar71[1];
          auVar44[1] = -((byte)pUVar7[1] == bVar77);
          bVar78 = auVar71[2];
          auVar44[2] = -(*(byte *)((long)pUVar7 + 3) == bVar78);
          bVar79 = auVar71[3];
          auVar44[3] = -((byte)pUVar7[2] == bVar79);
          auVar44[4] = -(*(byte *)((long)pUVar7 + 5) == bVar20);
          auVar44[5] = -((byte)pUVar7[3] == bVar77);
          auVar44[6] = -(*(byte *)((long)pUVar7 + 7) == bVar78);
          auVar44[7] = -((byte)pUVar7[4] == bVar79);
          auVar44[8] = -(*(byte *)((long)pUVar7 + 9) == bVar20);
          auVar44[9] = -((byte)pUVar7[5] == bVar77);
          auVar44[10] = -(*(byte *)((long)pUVar7 + 0xb) == bVar78);
          auVar44[0xb] = -((byte)pUVar7[6] == bVar79);
          auVar44[0xc] = -(*(byte *)((long)pUVar7 + 0xd) == bVar20);
          auVar44[0xd] = -((byte)pUVar7[7] == bVar77);
          auVar44[0xe] = -(*(byte *)((long)pUVar7 + 0xf) == bVar78);
          auVar44[0xf] = -((byte)pUVar7[8] == bVar79);
          auVar58[0] = -(*(byte *)((long)pUVar7 + 0x11) == bVar20);
          auVar58[1] = -((byte)pUVar7[9] == bVar77);
          auVar58[2] = -(*(byte *)((long)pUVar7 + 0x13) == bVar78);
          auVar58[3] = -((byte)pUVar7[10] == bVar79);
          auVar58[4] = -(*(byte *)((long)pUVar7 + 0x15) == bVar20);
          auVar58[5] = -((byte)pUVar7[0xb] == bVar77);
          auVar58[6] = -(*(byte *)((long)pUVar7 + 0x17) == bVar78);
          auVar58[7] = -((byte)pUVar7[0xc] == bVar79);
          auVar58[8] = -(*(byte *)((long)pUVar7 + 0x19) == bVar20);
          auVar58[9] = -((byte)pUVar7[0xd] == bVar77);
          auVar58[10] = -(*(byte *)((long)pUVar7 + 0x1b) == bVar78);
          auVar58[0xb] = -((byte)pUVar7[0xe] == bVar79);
          auVar58[0xc] = -(*(byte *)((long)pUVar7 + 0x1d) == bVar20);
          auVar58[0xd] = -((byte)pUVar7[0xf] == bVar77);
          auVar58[0xe] = -(*(byte *)((long)pUVar7 + 0x1f) == bVar78);
          auVar58[0xf] = -((byte)pUVar7[0x10] == bVar79);
          uVar32 = CONCAT22((ushort)(SUB161(auVar58 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar58[0xf] >> 7) << 0xf,
                            (ushort)(SUB161(auVar44 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar44[0xf] >> 7) << 0xf);
          uVar30 = uVar32 >> (bVar19 & 0x1f) | uVar32 << 0x20 - (bVar19 & 0x1f);
          if ((bVar19 & 0x1f) == 0) {
            uVar30 = uVar32;
          }
          for (lVar39 = 0; (uVar30 != 0 && ((int)lVar39 != 0x20)); lVar39 = lVar39 + 1) {
            iVar34 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
              }
            }
            if (pUVar6[uVar33 + (iVar34 + (uint)bVar19 & 0x1f)] < uVar23) break;
            auStack_b8[lVar39] = pUVar6[uVar33 + (iVar34 + (uint)bVar19 & 0x1f)];
            uVar30 = uVar30 - 1 & uVar30;
          }
          uVar23 = bVar19 - 1 & 0x1f;
          *(byte *)pUVar7 = (byte)uVar23;
          *(byte *)((long)pUVar7 + (ulong)uVar23 + 1) = auVar75[0];
          UVar31 = ms->nextToUpdate;
          ms->nextToUpdate = UVar31 + 1;
          pUVar6[uVar33 + uVar23] = UVar31;
          uVar33 = 999999999;
          uVar15 = 3;
          for (lVar37 = 0; lVar39 != lVar37; lVar37 = lVar37 + 1) {
            uVar23 = auStack_b8[lVar37];
            if (uVar23 < uVar21) {
              if (*(int *)(pBVar24 + uVar23) == *piVar38) {
                sVar13 = ZSTD_count_2segments
                                   ((BYTE *)((long)pIn + 5),pBVar24 + (ulong)uVar23 + 4,iEnd,
                                    pBVar24 + uVar21,pBVar17 + uVar21);
                sVar13 = sVar13 + 4;
LAB_001dcaaa:
                if ((uVar15 < sVar13) &&
                   (uVar33 = (ulong)((uVar35 + 2) - uVar23), uVar15 = sVar13,
                   (BYTE *)((long)piVar38 + sVar13) == iEnd)) break;
              }
            }
            else if ((pBVar17 + uVar23)[uVar15] == *(BYTE *)((long)piVar38 + uVar15)) {
              sVar13 = ZSTD_count((BYTE *)piVar38,pBVar17 + uVar23,iEnd);
              goto LAB_001dcaaa;
            }
          }
        }
        else {
          pUVar6 = ms->hashTable;
          pUVar7 = ms->tagTable;
          pBVar17 = (ms->window).base;
          pBVar24 = (ms->window).dictBase;
          uVar21 = (ms->window).dictLimit;
          uVar33 = (long)piVar38 - (long)pBVar17;
          uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar23 = (ms->window).lowLimit;
          uVar35 = (uint)uVar33;
          UVar31 = ms->loadedDictEnd;
          bVar19 = 0x18 - (char)ms->rowHashLog;
          for (uVar15 = (ulong)ms->nextToUpdate; uVar15 < (uVar33 & 0xffffffff); uVar15 = uVar15 + 1
              ) {
            uVar36 = (uint)uVar15 & 7;
            uVar32 = ms->hashCache[uVar36];
            ms->hashCache[uVar36] =
                 (uint)(*(int *)(pBVar17 + uVar15 + 8) * -0x61c8864f) >> (bVar19 & 0x1f);
            uVar29 = (ulong)(uVar32 >> 3 & 0xffffffe0);
            uVar36 = (byte)((char)pUVar7[uVar29] - 1) & 0x1f;
            *(char *)(pUVar7 + uVar29) = (char)uVar36;
            *(char *)((long)pUVar7 + (ulong)uVar36 + 1 + uVar29 * 2) = (char)uVar32;
            pUVar6[uVar29 + uVar36] = (uint)uVar15;
          }
          if (UVar31 == 0 && uVar30 < uVar35 - uVar23) {
            uVar23 = uVar35 - uVar30;
          }
          ms->nextToUpdate = uVar35;
          uVar30 = ms->hashCache[uVar35 & 7];
          ms->hashCache[uVar35 & 7] =
               (uint)(*(int *)(pBVar17 + (uVar33 & 0xffffffff) + 8) * -0x61c8864f) >>
               (bVar19 & 0x1f);
          uVar33 = (ulong)(uVar30 >> 3 & 0xffffffe0);
          pUVar7 = pUVar7 + uVar33;
          bVar19 = (byte)*pUVar7;
          uVar68 = (undefined1)(uVar30 >> 0x18);
          uVar66 = (undefined1)(uVar30 >> 0x10);
          uVar64 = (undefined1)(uVar30 >> 8);
          auVar76._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar68,uVar68),uVar66),CONCAT14(uVar66,uVar30)) >>
                    0x20);
          auVar76[3] = uVar64;
          auVar76[2] = uVar64;
          auVar76[0] = (byte)uVar30;
          auVar76[1] = auVar76[0];
          auVar76._8_8_ = 0;
          auVar71 = pshuflw(auVar76,auVar76,0);
          bVar20 = auVar71[0];
          auVar45[0] = -(*(byte *)((long)pUVar7 + 1) == bVar20);
          bVar77 = auVar71[1];
          auVar45[1] = -((byte)pUVar7[1] == bVar77);
          bVar78 = auVar71[2];
          auVar45[2] = -(*(byte *)((long)pUVar7 + 3) == bVar78);
          bVar79 = auVar71[3];
          auVar45[3] = -((byte)pUVar7[2] == bVar79);
          auVar45[4] = -(*(byte *)((long)pUVar7 + 5) == bVar20);
          auVar45[5] = -((byte)pUVar7[3] == bVar77);
          auVar45[6] = -(*(byte *)((long)pUVar7 + 7) == bVar78);
          auVar45[7] = -((byte)pUVar7[4] == bVar79);
          auVar45[8] = -(*(byte *)((long)pUVar7 + 9) == bVar20);
          auVar45[9] = -((byte)pUVar7[5] == bVar77);
          auVar45[10] = -(*(byte *)((long)pUVar7 + 0xb) == bVar78);
          auVar45[0xb] = -((byte)pUVar7[6] == bVar79);
          auVar45[0xc] = -(*(byte *)((long)pUVar7 + 0xd) == bVar20);
          auVar45[0xd] = -((byte)pUVar7[7] == bVar77);
          auVar45[0xe] = -(*(byte *)((long)pUVar7 + 0xf) == bVar78);
          auVar45[0xf] = -((byte)pUVar7[8] == bVar79);
          auVar61[0] = -(*(byte *)((long)pUVar7 + 0x11) == bVar20);
          auVar61[1] = -((byte)pUVar7[9] == bVar77);
          auVar61[2] = -(*(byte *)((long)pUVar7 + 0x13) == bVar78);
          auVar61[3] = -((byte)pUVar7[10] == bVar79);
          auVar61[4] = -(*(byte *)((long)pUVar7 + 0x15) == bVar20);
          auVar61[5] = -((byte)pUVar7[0xb] == bVar77);
          auVar61[6] = -(*(byte *)((long)pUVar7 + 0x17) == bVar78);
          auVar61[7] = -((byte)pUVar7[0xc] == bVar79);
          auVar61[8] = -(*(byte *)((long)pUVar7 + 0x19) == bVar20);
          auVar61[9] = -((byte)pUVar7[0xd] == bVar77);
          auVar61[10] = -(*(byte *)((long)pUVar7 + 0x1b) == bVar78);
          auVar61[0xb] = -((byte)pUVar7[0xe] == bVar79);
          auVar61[0xc] = -(*(byte *)((long)pUVar7 + 0x1d) == bVar20);
          auVar61[0xd] = -((byte)pUVar7[0xf] == bVar77);
          auVar61[0xe] = -(*(byte *)((long)pUVar7 + 0x1f) == bVar78);
          auVar61[0xf] = -((byte)pUVar7[0x10] == bVar79);
          uVar32 = CONCAT22((ushort)(SUB161(auVar61 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar61 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar61 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar61 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar61 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar61 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar61 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar61 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar61 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar61 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar61 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar61 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar61 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar61[0xf] >> 7) << 0xf,
                            (ushort)(SUB161(auVar45 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar45[0xf] >> 7) << 0xf);
          uVar30 = uVar32 >> (bVar19 & 0x1f) | uVar32 << 0x20 - (bVar19 & 0x1f);
          if ((bVar19 & 0x1f) == 0) {
            uVar30 = uVar32;
          }
          for (lVar39 = 0; (uVar30 != 0 && ((int)lVar39 != 0x20)); lVar39 = lVar39 + 1) {
            iVar34 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
              }
            }
            if (pUVar6[uVar33 + (iVar34 + (uint)bVar19 & 0x1f)] < uVar23) break;
            auStack_b8[lVar39] = pUVar6[uVar33 + (iVar34 + (uint)bVar19 & 0x1f)];
            uVar30 = uVar30 - 1 & uVar30;
          }
          uVar23 = bVar19 - 1 & 0x1f;
          *(byte *)pUVar7 = (byte)uVar23;
          *(byte *)((long)pUVar7 + (ulong)uVar23 + 1) = auVar76[0];
          UVar31 = ms->nextToUpdate;
          ms->nextToUpdate = UVar31 + 1;
          pUVar6[uVar33 + uVar23] = UVar31;
          uVar33 = 999999999;
          uVar15 = 3;
          for (lVar37 = 0; lVar39 != lVar37; lVar37 = lVar37 + 1) {
            uVar23 = auStack_b8[lVar37];
            if (uVar23 < uVar21) {
              if (*(int *)(pBVar24 + uVar23) == *piVar38) {
                sVar13 = ZSTD_count_2segments
                                   ((BYTE *)((long)pIn + 5),pBVar24 + (ulong)uVar23 + 4,iEnd,
                                    pBVar24 + uVar21,pBVar17 + uVar21);
                sVar13 = sVar13 + 4;
LAB_001dcd81:
                if ((uVar15 < sVar13) &&
                   (uVar33 = (ulong)((uVar35 + 2) - uVar23), uVar15 = sVar13,
                   (BYTE *)((long)piVar38 + sVar13) == iEnd)) break;
              }
            }
            else if ((pBVar17 + uVar23)[uVar15] == *(BYTE *)((long)piVar38 + uVar15)) {
              sVar13 = ZSTD_count((BYTE *)piVar38,pBVar17 + uVar23,iEnd);
              goto LAB_001dcd81;
            }
          }
        }
        if (uVar15 < 4) break;
        uVar23 = (int)uVar14 + 1;
        uVar21 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        uVar23 = (int)uVar33 + 1;
        iVar34 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> iVar34 == 0; iVar34 = iVar34 + -1) {
          }
        }
        pIn = piVar38;
      } while ((int)((uVar21 ^ 0x1f) + (int)uVar12 * 4 + -0x1b) < (int)uVar15 * 4 - iVar34);
      if (uVar14 == 0) {
        UVar31 = 1;
      }
      else {
        pBVar26 = (BYTE *)((long)local_130 + (-(long)base - uVar14) + 2);
        pBVar24 = iStart;
        pBVar17 = base;
        if ((uint)pBVar26 < uVar3) {
          pBVar24 = pBVar5 + uVar4;
          pBVar17 = pBVar5;
        }
        pBVar17 = pBVar17 + ((ulong)pBVar26 & 0xffffffff);
        for (; ((src < local_130 && (pBVar24 < pBVar17)) &&
               (*(BYTE *)((long)local_130 + -1) == pBVar17[-1]));
            local_130 = (int *)((long)local_130 + -1)) {
          pBVar17 = pBVar17 + -1;
          uVar12 = uVar12 + 1;
        }
        UVar31 = (int)uVar14 + 1;
        UVar28 = local_14c;
        local_14c = (int)uVar14 - 2;
      }
      uVar14 = (long)local_130 - (long)src;
      pBVar17 = seqStore->lit;
      if (ilimit_w < local_130) {
        ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)local_130,(BYTE *)ilimit_w);
LAB_001dcfcd:
        seqStore->lit = seqStore->lit + uVar14;
        psVar18 = seqStore->sequences;
        if (0xffff < uVar14) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        uVar9 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar17 = *src;
        *(undefined8 *)(pBVar17 + 8) = uVar9;
        pBVar17 = seqStore->lit;
        if (0x10 < uVar14) {
          uVar9 = *(undefined8 *)((long)src + 0x18);
          *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)((long)src + 0x10);
          *(undefined8 *)(pBVar17 + 0x18) = uVar9;
          if (0x20 < (long)uVar14) {
            lVar39 = 0;
            do {
              puVar2 = (undefined8 *)((long)src + lVar39 + 0x20);
              uVar9 = puVar2[1];
              pBVar24 = pBVar17 + lVar39 + 0x20;
              *(undefined8 *)pBVar24 = *puVar2;
              *(undefined8 *)(pBVar24 + 8) = uVar9;
              puVar2 = (undefined8 *)((long)src + lVar39 + 0x30);
              uVar9 = puVar2[1];
              *(undefined8 *)(pBVar24 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar24 + 0x18) = uVar9;
              lVar39 = lVar39 + 0x20;
            } while (pBVar24 + 0x20 < pBVar17 + uVar14);
          }
          goto LAB_001dcfcd;
        }
        seqStore->lit = pBVar17 + uVar14;
        psVar18 = seqStore->sequences;
      }
      psVar18->litLength = (U16)uVar14;
      psVar18->offset = UVar31;
      if (0xffff < uVar12 - 3) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar18->matchLength = (U16)(uVar12 - 3);
      seqStore->sequences = psVar18 + 1;
      UVar31 = UVar28;
      for (pIn = (int *)((long)local_130 + uVar12); UVar28 = UVar31, src = pIn, pIn <= iLimit;
          pIn = (int *)((long)pIn + sVar13 + 4)) {
        iVar27 = (int)pIn - (int)base;
        UVar31 = (ms->window).lowLimit;
        UVar22 = iVar27 - uVar10;
        if (iVar27 - UVar31 <= uVar10) {
          UVar22 = UVar31;
        }
        if (ms->loadedDictEnd != 0) {
          UVar22 = UVar31;
        }
        uVar21 = iVar27 - UVar28;
        pBVar17 = base;
        if (uVar21 < uVar3) {
          pBVar17 = pBVar5;
        }
        if (((iVar11 - uVar21 < 3) || (iVar27 - UVar22 <= UVar28)) ||
           (*pIn != *(int *)(pBVar17 + uVar21))) break;
        pBVar24 = iEnd;
        if (uVar21 < uVar3) {
          pBVar24 = pBVar25;
        }
        sVar13 = ZSTD_count_2segments
                           ((BYTE *)(pIn + 1),(BYTE *)((long)(pBVar17 + uVar21) + 4),iEnd,pBVar24,
                            iStart);
        pBVar17 = seqStore->lit;
        if (ilimit_w < pIn) {
          ZSTD_safecopyLiterals(pBVar17,(BYTE *)pIn,(BYTE *)pIn,(BYTE *)ilimit_w);
        }
        else {
          uVar9 = *(undefined8 *)(pIn + 2);
          *(undefined8 *)pBVar17 = *(undefined8 *)pIn;
          *(undefined8 *)(pBVar17 + 8) = uVar9;
        }
        psVar18 = seqStore->sequences;
        psVar18->litLength = 0;
        psVar18->offset = 1;
        if (0xffff < sVar13 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar18->matchLength = (U16)(sVar13 + 1);
        seqStore->sequences = psVar18 + 1;
        UVar31 = local_14c;
        local_14c = UVar28;
      }
      goto LAB_001daa17;
    }
    pIn = (int *)((long)pIn + ((long)pIn - (long)src >> 8) + 1);
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1);
}